

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_hr_line(MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET *p_end,MD_OFFSET *p_killer)

{
  bool bVar1;
  int n;
  MD_OFFSET off;
  MD_OFFSET *p_killer_local;
  MD_OFFSET *p_end_local;
  MD_OFFSET beg_local;
  MD_CTX *ctx_local;
  int local_4;
  
  off = beg + 1;
  n = 1;
  while( true ) {
    bVar1 = false;
    if (((off < ctx->size) && (bVar1 = true, ctx->text[off] != ctx->text[beg])) &&
       (bVar1 = true, ctx->text[off] != ' ')) {
      bVar1 = ctx->text[off] == '\t';
    }
    if (!bVar1) break;
    if (ctx->text[off] == ctx->text[beg]) {
      n = n + 1;
    }
    off = off + 1;
  }
  if (n < 3) {
    *p_killer = off;
    local_4 = 0;
  }
  else if (((off < ctx->size) && (ctx->text[off] != '\r')) && (ctx->text[off] != '\n')) {
    *p_killer = off;
    local_4 = 0;
  }
  else {
    *p_end = off;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
md_is_hr_line(MD_CTX* ctx, OFF beg, OFF* p_end, OFF* p_killer)
{
    OFF off = beg + 1;
    int n = 1;

    while(off < ctx->size  &&  (CH(off) == CH(beg) || CH(off) == _T(' ') || CH(off) == _T('\t'))) {
        if(CH(off) == CH(beg))
            n++;
        off++;
    }

    if(n < 3) {
        *p_killer = off;
        return FALSE;
    }

    /* Nothing else can be present on the line. */
    if(off < ctx->size  &&  !ISNEWLINE(off)) {
        *p_killer = off;
        return FALSE;
    }

    *p_end = off;
    return TRUE;
}